

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O0

void display_resets(CHAR_DATA *ch)

{
  short sVar1;
  ulong uVar2;
  char *pcVar3;
  MOB_INDEX_DATA *pMVar4;
  OBJ_INDEX_DATA *pOVar5;
  OBJ_INDEX_DATA *pOVar6;
  char *pcVar7;
  char *pcVar8;
  MOB_INDEX_DATA *pMVar9;
  ROOM_INDEX_DATA *pRVar10;
  long in_RDI;
  __type_conflict2 _Var11;
  ROOM_INDEX_DATA *pRoomIndexPrev;
  ROOM_INDEX_DATA *pRoomIndex;
  OBJ_INDEX_DATA *pObjToIndex;
  OBJ_INDEX_DATA *pObjIndex;
  MOB_INDEX_DATA *pMobIndex2;
  MOB_INDEX_DATA *pMobIndex;
  OBJ_INDEX_DATA *pObj;
  int iReset;
  char final [4608];
  char buf [4608];
  MOB_INDEX_DATA *pMob;
  RESET_DATA *pReset;
  ROOM_INDEX_DATA *pRoom;
  char *in_stack_ffffffffffffdb38;
  uint bits;
  flag_type *in_stack_ffffffffffffdb40;
  CHAR_DATA *in_stack_ffffffffffffdb48;
  int vnum;
  undefined4 in_stack_ffffffffffffdb50;
  uint in_stack_ffffffffffffdb54;
  char *local_2498;
  char local_2428 [5];
  undefined1 local_2423;
  CHAR_DATA local_1228 [5];
  MOB_INDEX_DATA *local_20;
  undefined8 *local_18;
  long local_10;
  
  local_20 = (MOB_INDEX_DATA *)0x0;
  local_10 = *(long *)(in_RDI + 0xa8);
  local_2428[0] = '\0';
  send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb54,in_stack_ffffffffffffdb50),
               in_stack_ffffffffffffdb48);
  local_18 = *(undefined8 **)(local_10 + 0x1b0);
  do {
    if (local_18 == (undefined8 *)0x0) {
      return;
    }
    local_2428[0] = '\0';
    sprintf(local_2428,"[%2d] ");
    vnum = (int)((ulong)in_stack_ffffffffffffdb48 >> 0x20);
    bits = (uint)((ulong)in_stack_ffffffffffffdb38 >> 0x20);
    switch(*(undefined1 *)(local_18 + 1)) {
    case 0x44:
      pRVar10 = get_room_index(vnum);
      in_stack_ffffffffffffdb48 = local_1228;
      in_stack_ffffffffffffdb54 = (uint)*(short *)((long)local_18 + 10);
      pcVar7 = capitalize(dir_name[*(short *)((long)local_18 + 0xc)]);
      pcVar3 = pRVar10->name;
      pcVar8 = flag_string_old(in_stack_ffffffffffffdb40,bits);
      sprintf((char *)in_stack_ffffffffffffdb48,"R[%5d] %s door of %-19.19s reset to %s\n\r",
              (ulong)in_stack_ffffffffffffdb54,pcVar7,pcVar3,pcVar8);
      strcat(local_2428,(char *)local_1228);
      goto LAB_007702d5;
    case 0x45:
    case 0x47:
      pOVar5 = get_obj_index(vnum);
      if (pOVar5 != (OBJ_INDEX_DATA *)0x0) {
        if (local_20 == (MOB_INDEX_DATA *)0x0) {
          sprintf((char *)local_1228,"Give/Equip Object - No Previous Mobile\n\r");
          strcat(local_2428,(char *)local_1228);
        }
        else {
          if (local_20->pShop == (SHOP_DATA *)0x0) {
            sVar1 = *(short *)((long)local_18 + 10);
            pcVar3 = pOVar5->short_descr;
            if (*(char *)(local_18 + 1) == 'G') {
              local_2498 = flag_string_old(in_stack_ffffffffffffdb40,bits);
            }
            else {
              local_2498 = flag_string_old(in_stack_ffffffffffffdb40,bits);
            }
            in_stack_ffffffffffffdb38 = local_20->short_descr;
            sprintf((char *)local_1228,"O[%5d] %-13.13s %-19.19s M[%5d]       %-15.15s\n\r",
                    (ulong)(uint)(int)sVar1,pcVar3,local_2498,(ulong)(uint)(int)local_20->vnum);
          }
          else {
            sprintf((char *)local_1228,
                    "O[%5d] %-13.13s in the inventory of S[%5d]       %-15.15s\n\r",
                    (ulong)(uint)(int)*(short *)((long)local_18 + 10),pOVar5->short_descr,
                    (ulong)(uint)(int)local_20->vnum,local_20->short_descr);
          }
          strcat(local_2428,(char *)local_1228);
        }
        goto LAB_007702d5;
      }
      sprintf((char *)local_1228,"Give/Equip Object - Bad Object %d\n\r",
              (ulong)(uint)(int)*(short *)((long)local_18 + 10));
      strcat(local_2428,(char *)local_1228);
      break;
    case 0x46:
      pMVar4 = get_mob_index(vnum);
      pMVar9 = get_mob_index((int)((ulong)in_stack_ffffffffffffdb48 >> 0x20));
      in_stack_ffffffffffffdb38 = pMVar9->short_descr;
      sprintf((char *)local_1228,"R[%5d] %-13.13s %-19.19s M[%5d]        %-15.15s\n\r",
              (ulong)(uint)(int)pMVar4->vnum,pMVar4->short_descr,"will follow",
              (ulong)(uint)(int)pMVar9->vnum);
      strcat(local_2428,(char *)local_1228);
      goto LAB_007702d5;
    default:
      sprintf((char *)local_1228,"Bad reset command: %c.",(ulong)(uint)(int)*(char *)(local_18 + 1))
      ;
      strcat(local_2428,(char *)local_1228);
LAB_007702d5:
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb54,in_stack_ffffffffffffdb50),
                   in_stack_ffffffffffffdb48);
      break;
    case 0x4d:
      pMVar4 = get_mob_index(vnum);
      if (pMVar4 == (MOB_INDEX_DATA *)0x0) {
        sprintf((char *)local_1228,"Load Mobile - Bad Mob %d\n\r",
                (ulong)(uint)(int)*(short *)((long)local_18 + 10));
        strcat(local_2428,(char *)local_1228);
      }
      else {
        pRVar10 = get_room_index((int)((ulong)in_stack_ffffffffffffdb48 >> 0x20));
        if (pRVar10 != (ROOM_INDEX_DATA *)0x0) {
          in_stack_ffffffffffffdb40 = (flag_type *)pRVar10->name;
          in_stack_ffffffffffffdb38 = (char *)((ulong)bits << 0x20);
          local_20 = pMVar4;
          sprintf((char *)local_1228,
                  "M[%5d] %-13.13s in room             R[%5d] %2d-%2d %-15.15s\n\r",
                  (ulong)(uint)(int)*(short *)((long)local_18 + 10),pMVar4->short_descr,
                  (ulong)(uint)(int)*(short *)((long)local_18 + 0xe),
                  (ulong)(uint)(int)*(short *)((long)local_18 + 0xc));
          strcat(local_2428,(char *)local_1228);
          pRVar10 = get_room_index((int)((ulong)in_stack_ffffffffffffdb48 >> 0x20));
          if ((pRVar10 != (ROOM_INDEX_DATA *)0x0) &&
             (uVar2 = pRVar10->room_flags[0], _Var11 = std::pow<int,int>(0,0x76fc64),
             (uVar2 & (long)_Var11) != 0)) {
            local_2423 = 0x50;
          }
          goto LAB_007702d5;
        }
        sprintf((char *)local_1228,"Load Mobile - Bad Room %d\n\r",
                (ulong)(uint)(int)*(short *)((long)local_18 + 0xe));
        strcat(local_2428,(char *)local_1228);
      }
      break;
    case 0x4f:
      pOVar5 = get_obj_index(vnum);
      if (pOVar5 == (OBJ_INDEX_DATA *)0x0) {
        sprintf((char *)local_1228,"Load Object - Bad Object %d\n\r",
                (ulong)(uint)(int)*(short *)((long)local_18 + 10));
        strcat(local_2428,(char *)local_1228);
      }
      else {
        pRVar10 = get_room_index((int)((ulong)in_stack_ffffffffffffdb48 >> 0x20));
        if (pRVar10 != (ROOM_INDEX_DATA *)0x0) {
          sprintf((char *)local_1228,"O[%5d] %-13.13s in room             R[%5d]       %-15.15s\n\r"
                  ,(ulong)(uint)(int)*(short *)((long)local_18 + 10),pOVar5->short_descr,
                  (ulong)(uint)(int)*(short *)((long)local_18 + 0xe),pRVar10->name);
          strcat(local_2428,(char *)local_1228);
          goto LAB_007702d5;
        }
        sprintf((char *)local_1228,"Load Object - Bad Room %d\n\r",
                (ulong)(uint)(int)*(short *)((long)local_18 + 0xe));
        strcat(local_2428,(char *)local_1228);
      }
      break;
    case 0x50:
      pOVar5 = get_obj_index(vnum);
      if (pOVar5 == (OBJ_INDEX_DATA *)0x0) {
        sprintf((char *)local_1228,"Put Object - Bad Object %d\n\r",
                (ulong)(uint)(int)*(short *)((long)local_18 + 10));
        strcat(local_2428,(char *)local_1228);
      }
      else {
        pOVar6 = get_obj_index((int)((ulong)in_stack_ffffffffffffdb48 >> 0x20));
        if (pOVar6 != (OBJ_INDEX_DATA *)0x0) {
          in_stack_ffffffffffffdb40 = (flag_type *)pOVar6->short_descr;
          in_stack_ffffffffffffdb38 = (char *)((ulong)bits << 0x20);
          sprintf((char *)local_1228,
                  "O[%5d] %-13.13s inside              O[%5d] %2d-%2d %-15.15s\n\r",
                  (ulong)(uint)(int)*(short *)((long)local_18 + 10),pOVar5->short_descr,
                  (ulong)(uint)(int)*(short *)((long)local_18 + 0xe),
                  (ulong)(uint)(int)*(short *)((long)local_18 + 0xc));
          strcat(local_2428,(char *)local_1228);
          goto LAB_007702d5;
        }
        sprintf((char *)local_1228,"Put Object - Bad To Object %d\n\r",
                (ulong)(uint)(int)*(short *)((long)local_18 + 0xe));
        strcat(local_2428,(char *)local_1228);
      }
      break;
    case 0x52:
      pRVar10 = get_room_index(vnum);
      if (pRVar10 != (ROOM_INDEX_DATA *)0x0) {
        sprintf((char *)local_1228,"R[%5d] Exits are randomized in %s\n\r",
                (ulong)(uint)(int)*(short *)((long)local_18 + 10),pRVar10->name);
        strcat(local_2428,(char *)local_1228);
        goto LAB_007702d5;
      }
      sprintf((char *)local_1228,"Randomize Exits - Bad Room %d\n\r",
              (ulong)(uint)(int)*(short *)((long)local_18 + 10));
      strcat(local_2428,(char *)local_1228);
    }
    local_18 = (undefined8 *)*local_18;
  } while( true );
}

Assistant:

void display_resets(CHAR_DATA *ch)
{
	ROOM_INDEX_DATA *pRoom;
	RESET_DATA *pReset;
	MOB_INDEX_DATA *pMob = nullptr;
	char buf[MAX_STRING_LENGTH];
	char final[MAX_STRING_LENGTH];
	int iReset = 0;

	EDIT_ROOM(ch, pRoom);
	final[0] = '\0';

	send_to_char(" No.  Loads    Description       Location         Vnum   Mx Mn Description"
				 "\n\r"
				 "==== ======== ============= =================== ======== ===== ==========="
				 "\n\r",
				 ch);

	for (pReset = pRoom->reset_first; pReset; pReset = pReset->next)
	{
		OBJ_INDEX_DATA *pObj;
		MOB_INDEX_DATA *pMobIndex;
		MOB_INDEX_DATA *pMobIndex2;
		OBJ_INDEX_DATA *pObjIndex;
		OBJ_INDEX_DATA *pObjToIndex;
		ROOM_INDEX_DATA *pRoomIndex;

		final[0] = '\0';
		sprintf(final, "[%2d] ", ++iReset);

		switch (pReset->command)
		{
			case 'M':
				if (!(pMobIndex = get_mob_index(pReset->arg1)))
				{
					sprintf(buf, "Load Mobile - Bad Mob %d\n\r", pReset->arg1);
					strcat(final, buf);
					continue;
				}

				if (!(pRoomIndex = get_room_index(pReset->arg3)))
				{
					sprintf(buf, "Load Mobile - Bad Room %d\n\r", pReset->arg3);
					strcat(final, buf);
					continue;
				}

				pMob = pMobIndex;
				sprintf(buf, "M[%5d] %-13.13s in room             R[%5d] %2d-%2d %-15.15s\n\r",
					pReset->arg1,
					pMob->short_descr,
					pReset->arg3,
					pReset->arg2,
					pReset->arg4,
					pRoomIndex->name);
				strcat(final, buf);

				/*
				* Check for pet shop.
				* -------------------
				*/
				{
					ROOM_INDEX_DATA *pRoomIndexPrev;

					pRoomIndexPrev = get_room_index(pRoomIndex->vnum - 1);

					if (pRoomIndexPrev && IS_SET(pRoomIndexPrev->room_flags, ROOM_PET_SHOP))
						final[5] = 'P';
				}

				break;
			case 'O':
				if (!(pObjIndex = get_obj_index(pReset->arg1)))
				{
					sprintf(buf, "Load Object - Bad Object %d\n\r", pReset->arg1);
					strcat(final, buf);
					continue;
				}

				pObj = pObjIndex;

				if (!(pRoomIndex = get_room_index(pReset->arg3)))
				{
					sprintf(buf, "Load Object - Bad Room %d\n\r", pReset->arg3);
					strcat(final, buf);
					continue;
				}

				sprintf(buf,
						"O[%5d] %-13.13s in room             "\
						"R[%5d]       %-15.15s\n\r",
						pReset->arg1, pObj->short_descr, pReset->arg3, pRoomIndex->name);
				strcat(final, buf);

				break;
			case 'P':
				if (!(pObjIndex = get_obj_index(pReset->arg1)))
				{
					sprintf(buf, "Put Object - Bad Object %d\n\r", pReset->arg1);
					strcat(final, buf);
					continue;
				}

				pObj = pObjIndex;

				if (!(pObjToIndex = get_obj_index(pReset->arg3)))
				{
					sprintf(buf, "Put Object - Bad To Object %d\n\r", pReset->arg3);
					strcat(final, buf);
					continue;
				}

				sprintf(buf, "O[%5d] %-13.13s inside              O[%5d] %2d-%2d %-15.15s\n\r",
					pReset->arg1,
					pObj->short_descr,
					pReset->arg3,
					pReset->arg2,
					pReset->arg4,
					pObjToIndex->short_descr);
				strcat(final, buf);
				break;
			case 'G':
			case 'E':
				if (!(pObjIndex = get_obj_index(pReset->arg1)))
				{
					sprintf(buf, "Give/Equip Object - Bad Object %d\n\r", pReset->arg1);
					strcat(final, buf);
					continue;
				}

				pObj = pObjIndex;

				if (!pMob)
				{
					sprintf(buf, "Give/Equip Object - No Previous Mobile\n\r");
					strcat(final, buf);
					break;
				}

				if (pMob->pShop)
				{
					sprintf(buf, "O[%5d] %-13.13s in the inventory of S[%5d]       %-15.15s\n\r",
						pReset->arg1,
						pObj->short_descr,
						pMob->vnum,
						pMob->short_descr);
				}
				else
				{
					sprintf(buf, "O[%5d] %-13.13s %-19.19s M[%5d]       %-15.15s\n\r",
						pReset->arg1,
						pObj->short_descr,
						pReset->command == 'G'
							? flag_string_old(wear_loc_strings, WEAR_NONE)
							: flag_string_old(wear_loc_strings, pReset->arg3),
						pMob->vnum, pMob->short_descr);
				}

				strcat(final, buf);
				break;
			/*
			* Doors are set in rs_flags don't need to be displayed.
			* If you want to display them then uncomment the new_reset
			* line in the case 'D' in load_resets in db.c and here.
			*/
			case 'D':
				pRoomIndex = get_room_index(pReset->arg1);
				sprintf(buf, "R[%5d] %s door of %-19.19s reset to %s\n\r",
					pReset->arg1,
					capitalize(dir_name[pReset->arg2]),
					pRoomIndex->name,
					flag_string_old(door_resets, pReset->arg3));
				strcat(final, buf);
				break;
			case 'F':
				pMobIndex = get_mob_index(pReset->arg1);
				pMobIndex2 = get_mob_index(pReset->arg2);
				sprintf(buf, "R[%5d] %-13.13s %-19.19s M[%5d]        %-15.15s\n\r",
					pMobIndex->vnum,
					pMobIndex->short_descr,
					"will follow",
					pMobIndex2->vnum,
					pMobIndex2->short_descr);
				strcat(final, buf);
				break;
			/*
			* End Doors Comment.
			*/
			case 'R':
				if (!(pRoomIndex = get_room_index(pReset->arg1)))
				{
					sprintf(buf, "Randomize Exits - Bad Room %d\n\r", pReset->arg1);
					strcat(final, buf);
					continue;
				}

				sprintf(buf, "R[%5d] Exits are randomized in %s\n\r", pReset->arg1, pRoomIndex->name);
				strcat(final, buf);
				break;
			default:
				sprintf(buf, "Bad reset command: %c.", pReset->command);
				strcat(final, buf);
				break;
		}

		send_to_char(final, ch);
	}
}